

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<int,_QString>::insert(QMultiMap<int,_QString> *this,int *key,QString *value)

{
  bool bVar1;
  const_iterator __position;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<int,_QString> copy;
  iterator in_stack_ffffffffffffff48;
  pair<const_int,_QString> *in_stack_ffffffffffffff50;
  _Rb_tree_const_iterator<std::pair<const_int,_QString>_> local_28;
  iterator local_20;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
          ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
                      *)in_stack_ffffffffffffff50);
  if (bVar1) {
    QMultiMap((QMultiMap<int,_QString> *)in_stack_ffffffffffffff50,
              (QMultiMap<int,_QString> *)in_stack_ffffffffffffff48._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<int,_QString> *)0x44a914);
  }
  detach((QMultiMap<int,_QString> *)in_stack_ffffffffffffff50);
  local_20._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
                *)0x44a93c);
  local_20._M_node =
       (_Base_ptr)
       std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>
       ::lower_bound(in_stack_ffffffffffffff48._M_node,(key_type *)0x44a956);
  __position._M_node =
       (_Base_ptr)
       QtPrivate::
       QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
       ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
                     *)0x44a974);
  std::_Rb_tree_const_iterator<std::pair<const_int,_QString>_>::_Rb_tree_const_iterator
            (&local_28,&local_20);
  std::pair<const_int,_QString>::pair<const_int,_QString,_true>
            (in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48._M_node,(QString *)0x44a9b2)
  ;
  std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>::
  insert((multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_> *)
         in_stack_ffffffffffffff50,__position,(value_type *)in_stack_ffffffffffffff48._M_node);
  iterator::iterator((iterator *)0x44a9ee,in_stack_ffffffffffffff48);
  std::pair<const_int,_QString>::~pair((pair<const_int,_QString> *)0x44a9fa);
  ~QMultiMap((QMultiMap<int,_QString> *)0x44aa07);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }